

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_parser.cpp
# Opt level: O3

shared_ptr<Node> ParseCondition(istream *is)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 *puVar1;
  logic_error *this_00;
  Node *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  istream *in_RSI;
  shared_ptr<Node> sVar2;
  iterator current;
  vector<Token,_std::allocator<Token>_> tokens;
  pointer local_38;
  vector<Token,_std::allocator<Token>_> local_30;
  
  Tokenize(&local_30,in_RSI);
  local_38 = local_30.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
  ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
            ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)is,
             (Token *)&local_38,
             (uint)local_30.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                   super__Vector_impl_data._M_finish);
  if (*(long *)is == 0) {
    puVar1 = (undefined8 *)operator_new(0x18);
    puVar1[1] = 0x100000001;
    *puVar1 = &PTR___Sp_counted_ptr_inplace_00116c58;
    puVar1[2] = &PTR_Evaluate_00116cf0;
    *(undefined8 **)is = puVar1 + 2;
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(is + 8);
    *(undefined8 **)(is + 8) = puVar1;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  if (local_38 ==
      local_30.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::vector<Token,_std::allocator<Token>_>::~vector(&local_30);
    sVar2.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)is;
    return (shared_ptr<Node>)sVar2.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Unexpected tokens after condition");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

shared_ptr<Node> ParseCondition(istream& is) {
    auto tokens = Tokenize(is);
    auto current = tokens.begin();
    auto top_node = ParseExpression(current, tokens.end(), 0u);

    if (!top_node) {
        top_node = make_shared<EmptyNode>();
    }

    if (current != tokens.end()) {
        throw logic_error("Unexpected tokens after condition");
    }

    return top_node;
}